

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int lj_cf_string_format(lua_State *L)

{
  uint64_t uVar1;
  TValue *pTVar2;
  int iVar3;
  GCstr *pGVar4;
  
  iVar3 = 0;
  do {
    uVar1 = (L->glref).ptr64;
    *(lua_State **)(uVar1 + 0xe0) = L;
    *(undefined8 *)(uVar1 + 200) = *(undefined8 *)(uVar1 + 0xd8);
    iVar3 = lj_strfmt_putarg(L,(SBuf *)(uVar1 + 200),1,-iVar3);
  } while (0 < iVar3);
  pTVar2 = L->top;
  pGVar4 = lj_str_new(L,*(char **)(uVar1 + 0xd8),
                      (ulong)(uint)(*(int *)(uVar1 + 200) - (int)*(char **)(uVar1 + 0xd8)));
  pTVar2[-1].u64 = (ulong)pGVar4 | 0xfffd800000000000;
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(string_format)		LJLIB_REC(.)
{
  int retry = 0;
  SBuf *sb;
  do {
    sb = lj_buf_tmp_(L);
    retry = lj_strfmt_putarg(L, sb, 1, -retry);
  } while (retry > 0);
  setstrV(L, L->top-1, lj_buf_str(L, sb));
  lj_gc_check(L);
  return 1;
}